

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O2

bool __thiscall CorUnix::CSharedMemoryObject::DereferenceSharedData(CSharedMemoryObject *this)

{
  int iVar1;
  BOOL BVar2;
  SHMPTR *pSVar3;
  LPVOID pvVar4;
  SHMPTR *pSVar5;
  
  if (PAL_InitializeChakraCoreCalled) {
    LOCK();
    iVar1 = this->m_fSharedDataDereferenced;
    this->m_fSharedDataDereferenced = 1;
    UNLOCK();
    if (iVar1 == 0) {
      if (this->m_shmod == 0) {
        if (this->m_ObjectDomain == ProcessLocalObject) {
          this->m_fDeleteSharedData = 1;
        }
      }
      else {
        SHMLock();
        pSVar3 = (SHMPTR *)SHMPtrToPtr(this->m_shmod);
        if (pSVar3 == (SHMPTR *)0x0) {
          fprintf(_stderr,"] %s %s:%d","DereferenceSharedData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0x303);
          fprintf(_stderr,"Expression: NULL != psmod\n");
        }
        pSVar5 = pSVar3 + 6;
        *(int *)pSVar5 = (int)*pSVar5 + -1;
        if ((int)*pSVar5 == 0) {
          this->m_fDeleteSharedData = 1;
          if ((int)pSVar3[2] == 0) {
            if (*pSVar3 != 0) {
              fprintf(_stderr,"] %s %s:%d","DereferenceSharedData",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                      ,0x338);
              fprintf(_stderr,"Expression: SHMNULL == psmod->shmPrevObj\n");
            }
            if (pSVar3[1] != 0) {
              fprintf(_stderr,"] %s %s:%d","DereferenceSharedData",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                      ,0x339);
              fprintf(_stderr,"Expression: SHMNULL == psmod->shmNextObj\n");
            }
          }
          else {
            if (*(int *)((long)pSVar3 + 0x34) == 0) {
              fprintf(_stderr,"] %s %s:%d","DereferenceSharedData",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                      ,0x317);
              fprintf(_stderr,"Expression: 0 != psmod->dwNameLength\n");
            }
            if (*pSVar3 == 0) {
              BVar2 = SHMSetInfo(SIID_NAMED_OBJECTS,pSVar3[1]);
              if (BVar2 == 0) {
                fprintf(_stderr,"] %s %s:%d","DereferenceSharedData",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                        ,0x329);
                fprintf(_stderr,"Failed to set shared named object list head");
              }
            }
            else {
              pvVar4 = SHMPtrToPtr(*pSVar3);
              if (pvVar4 == (LPVOID)0x0) {
                fprintf(_stderr,"] %s %s:%d","DereferenceSharedData",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                        ,0x31c);
                fprintf(_stderr,"Expression: NULL != psmodPrevious\n");
              }
              *(SHMPTR *)((long)pvVar4 + 8) = pSVar3[1];
            }
            if (pSVar3[1] != 0) {
              pSVar5 = (SHMPTR *)SHMPtrToPtr(pSVar3[1]);
              if (pSVar5 == (SHMPTR *)0x0) {
                fprintf(_stderr,"] %s %s:%d","DereferenceSharedData",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                        ,0x330);
                fprintf(_stderr,"Expression: NULL != psmodNext\n");
              }
              *pSVar5 = *pSVar3;
            }
          }
        }
        SHMRelease();
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","DereferenceSharedData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x34c);
      fprintf(_stderr,"Multiple calls to DereferenceSharedData\n");
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return this->m_fDeleteSharedData != 0;
    }
  }
  abort();
}

Assistant:

bool
CSharedMemoryObject::DereferenceSharedData()
{
    LONG fSharedDataAlreadDereferenced;

    ENTRY("CSharedMemoryObject::DereferenceSharedData(this = %p)\n", this);

    fSharedDataAlreadDereferenced = InterlockedExchange(
        &m_fSharedDataDereferenced,
        TRUE
        );

    if (!fSharedDataAlreadDereferenced)
    {   
        if (SHMNULL != m_shmod)
        {
            SHMObjData *psmod;
            
            SHMLock();

            psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, m_shmod);
            _ASSERTE(NULL != psmod);
            
            psmod->lProcessRefCount -= 1;
            if (0 == psmod->lProcessRefCount)
            {
                //
                // No other process is using this object, so remove
                // it from the shared memory named object list (if it
                // had been added to it). The final cleanup will happen
                // in the object's destructor
                //

                m_fDeleteSharedData = TRUE;

                if (psmod->fAddedToList)
                {
                    //
                    // This object better have a name...
                    //

                    _ASSERTE(0 != psmod->dwNameLength);

                    if (SHMNULL != psmod->shmPrevObj)
                    {
                        SHMObjData *psmodPrevious = SHMPTR_TO_TYPED_PTR(SHMObjData, psmod->shmPrevObj);
                        _ASSERTE(NULL != psmodPrevious);

                        psmodPrevious->shmNextObj = psmod->shmNextObj;
                    }
                    else
                    {
                        //
                        // This object is the head of the shared memory named object
                        // list -- reset that pointer now
                        //

                        if (!SHMSetInfo(SIID_NAMED_OBJECTS, psmod->shmNextObj))
                        {
                            ASSERT("Failed to set shared named object list head");
                        }
                    }

                    if (SHMNULL != psmod->shmNextObj)
                    {
                        SHMObjData *psmodNext = SHMPTR_TO_TYPED_PTR(SHMObjData, psmod->shmNextObj);
                        _ASSERTE(NULL != psmodNext);
                        
                        psmodNext->shmPrevObj = psmod->shmPrevObj;
                    }
                }
#if _DEBUG                
                else
                {
                    _ASSERTE(SHMNULL == psmod->shmPrevObj);
                    _ASSERTE(SHMNULL == psmod->shmNextObj);
                }
#endif                
            }

            SHMRelease();
        }
        else if (ProcessLocalObject == m_ObjectDomain)
        {
            //
            // If the object is local the shared data needs to be
            // deleted by definition
            //
            
            m_fDeleteSharedData = TRUE;
        }
    }
    else
    {
        ASSERT("Multiple calls to DereferenceSharedData\n");
    }

    LOGEXIT("CSharedMemoryObject::DereferenceSharedData returns %d\n",
        m_fDeleteSharedData
        );

    return m_fDeleteSharedData;
}